

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O2

void __thiscall xe::xml::Writer::Attribute::Attribute(Attribute *this,char *name_,string *value_)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_11);
  std::__cxx11::string::string((string *)&this->value,(string *)value_);
  return;
}

Assistant:

Attribute (const char* name_, const std::string& value_) : name(name_), value(value_) {}